

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker3F1S.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  WorkerFlow *pWVar2;
  WorkerCallback *this;
  string local_4a0;
  WorkerCallback *local_480;
  WorkerCallback *cb;
  string local_458;
  WorkerFlow *local_438;
  WorkerFlow *flow;
  string local_428;
  JSONElement local_408;
  undefined1 local_3f0 [8];
  string filename;
  string local_3c8;
  JSONElement local_3a8;
  int local_38c;
  int flow_port;
  JSMNUtilsEx *ex_2;
  string local_378;
  JSONElement local_358;
  JSMNUtilsEx *ex_1;
  string local_330;
  JSONElement local_310;
  string local_2f8;
  int local_2d4;
  string local_2d0 [4];
  int flow_buffsize;
  string flow_connect;
  string local_2a8;
  JSONElement local_288;
  undefined1 local_270 [8];
  string flow_name;
  undefined1 local_238 [8];
  JSONObject flow_config;
  undefined1 local_218 [4];
  int i;
  WorkerStream ws;
  JSMNUtilsEx *ex;
  string local_1d8;
  JSONElement local_1b8;
  allocator<char> local_199;
  string local_198;
  JSONElement local_178;
  undefined1 local_160 [8];
  JSONArray flows_config;
  string local_140;
  JSONElement local_120;
  undefined1 local_108 [8];
  string default_connect;
  undefined1 local_d0 [8];
  JSONObject config;
  undefined1 local_98 [8];
  JSONParser parser;
  allocator<char> local_41;
  string local_40 [8];
  string config_file;
  size_t buffsize;
  char **argv_local;
  int argc_local;
  
  config_file.field_2._8_8_ = 0x800;
  if (argc != 2) {
    usage(argv);
  }
  __s = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,__s,&local_41);
  std::allocator<char>::~allocator(&local_41);
  JSONParser::JSONParser((JSONParser *)local_98);
  std::__cxx11::string::string((string *)&config.m_buffer,local_40);
  JSONParser::load_file((JSONParser *)local_98,(string *)&config.m_buffer);
  std::__cxx11::string::~string((string *)&config.m_buffer);
  JSONParser::parse((JSONElement *)((long)&default_connect.field_2 + 8),(JSONParser *)local_98);
  JSONElement::operator_cast_to_JSONObject
            ((JSONObject *)local_d0,(JSONElement *)((long)&default_connect.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"bind",(allocator<char> *)((long)&flows_config.m_buffer + 7));
  JSONObject::operator[](&local_120,(JSONObject *)local_d0,&local_140);
  JSONElement::operator_cast_to_string((string *)local_108,&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&flows_config.m_buffer + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"flows",&local_199);
  JSONObject::operator[](&local_178,(JSONObject *)local_d0,&local_198);
  JSONElement::operator_cast_to_JSONArray((JSONArray *)local_160,&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"buffsize",(allocator<char> *)((long)&ex + 7));
  JSONObject::operator[](&local_1b8,(JSONObject *)local_d0,&local_1d8);
  iVar1 = JSONElement::operator_cast_to_int(&local_1b8);
  config_file.field_2._8_8_ = SEXT48(iVar1);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ex + 7));
  WorkerStream::WorkerStream((WorkerStream *)local_218);
  for (flow_config.m_buffer._4_4_ = 0; flow_config.m_buffer._4_4_ < 3;
      flow_config.m_buffer._4_4_ = flow_config.m_buffer._4_4_ + 1) {
    JSONArray::operator[]
              ((JSONElement *)((long)&flow_name.field_2 + 8),(JSONArray *)local_160,
               (long)flow_config.m_buffer._4_4_);
    JSONElement::operator_cast_to_JSONObject
              ((JSONObject *)local_238,(JSONElement *)((long)&flow_name.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"name",
               (allocator<char> *)(flow_connect.field_2._M_local_buf + 0xf));
    JSONObject::operator[](&local_288,(JSONObject *)local_238,&local_2a8);
    JSONElement::operator_cast_to_string((string *)local_270,&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)(flow_connect.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string(local_2d0,(string *)local_108);
    local_2d4 = config_file.field_2._8_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,"bind",(allocator<char> *)((long)&ex_1 + 7));
    JSONObject::operator[](&local_310,(JSONObject *)local_238,&local_330);
    JSONElement::operator_cast_to_string(&local_2f8,&local_310);
    std::__cxx11::string::operator=(local_2d0,(string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ex_1 + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"buffsize",(allocator<char> *)((long)&ex_2 + 7));
    JSONObject::operator[](&local_358,(JSONObject *)local_238,&local_378);
    local_2d4 = JSONElement::operator_cast_to_int(&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ex_2 + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"port",(allocator<char> *)(filename.field_2._M_local_buf + 0xf))
    ;
    JSONObject::operator[](&local_3a8,(JSONObject *)local_238,&local_3c8);
    iVar1 = JSONElement::operator_cast_to_int(&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
    local_38c = iVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"file",(allocator<char> *)((long)&flow + 7));
    JSONObject::operator[](&local_408,(JSONObject *)local_238,&local_428);
    JSONElement::operator_cast_to_string((string *)local_3f0,&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator((allocator<char> *)((long)&flow + 7));
    std::__cxx11::string::string((string *)&local_458,(string *)local_270);
    std::__cxx11::string::string((string *)&cb,local_2d0);
    pWVar2 = WorkerStream::create_flow
                       ((WorkerStream *)local_218,&local_458,(string *)&cb,local_38c,(long)local_2d4
                       );
    std::__cxx11::string::~string((string *)&cb);
    std::__cxx11::string::~string((string *)&local_458);
    local_438 = pWVar2;
    this = (WorkerCallback *)operator_new(0x10);
    std::__cxx11::string::string((string *)&local_4a0,(string *)local_3f0);
    WorkerCallback::WorkerCallback(this,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    local_480 = this;
    WorkerFlow::set_callback(local_438,(Callback *)this);
    WorkerFlow::own_callback(local_438);
    std::__cxx11::string::operator=((string *)local_3f0,(string *)local_3f0);
    std::__cxx11::string::~string((string *)local_3f0);
    std::__cxx11::string::~string(local_2d0);
    std::__cxx11::string::~string((string *)local_270);
  }
  WorkerStream::start((WorkerStream *)local_218);
  WorkerStream::~WorkerStream((WorkerStream *)local_218);
  std::__cxx11::string::~string((string *)local_108);
  JSONParser::~JSONParser((JSONParser *)local_98);
  std::__cxx11::string::~string(local_40);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    size_t buffsize = 2048;

    if (argc != 2) {
        usage(argv);
    }
    std::string config_file(argv[1]);

    // Parse config file (assume it has no errors)
    JSONParser parser;
    parser.load_file(config_file);
    JSONObject config = parser.parse();

    // REQUIRED: default connect
    std::string default_connect = config["bind"];
    JSONArray flows_config = config["flows"];
    try {
        buffsize = (int)config["buffsize"];
    } catch (JSMNUtilsEx &ex) {
        // buffsize stays default
    }
    // Initialize WorkerStream
    WorkerStream ws;

    for (int i = 0; i < N_THREADS; i++) {
        JSONObject flow_config = flows_config[i];
        std::string flow_name = flow_config["name"];
        std::string flow_connect = default_connect;
        int flow_buffsize = buffsize;
        try {
            flow_connect = (std::string)flow_config["bind"];
        } catch (JSMNUtilsEx &ex) {
            // bind stays default
        }
        try {
            flow_buffsize = (int)flow_config["buffsize"];
        } catch (JSMNUtilsEx &ex) {
            // buffsize stays default
        }
        int flow_port = flow_config["port"];
        //std::stringstream ss;
        //ss << flow_connect << ":" << flow_port;
        //flow_connect = ss.str(); // something like "tcp://localhost:5000"
        std::string filename = flow_config["file"];
        // Create flow
        WorkerFlow *flow = ws.create_flow(flow_name, flow_connect, flow_port,
                flow_buffsize);
        WorkerCallback *cb = new WorkerCallback(filename);
        flow->set_callback(cb);
        flow->own_callback(); // take care of it
        filename = filename;
        buffsize = buffsize;
    }

    // call the start method to loop workers.
    ws.start();
}